

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TxSetType av1_get_ext_tx_set_type(TX_SIZE tx_size,int is_inter,int use_reduced_set)

{
  TX_SIZE tx_size_sqr;
  TX_SIZE tx_size_sqr_up;
  int use_reduced_set_local;
  int is_inter_local;
  TX_SIZE tx_size_local;
  TxSetType local_1;
  
  if (""[tx_size] < 4) {
    if (""[tx_size] == 3) {
      local_1 = is_inter != 0;
    }
    else if (use_reduced_set == 0) {
      local_1 = av1_ext_tx_set_lookup[is_inter][(int)(uint)(""[tx_size] == '\x02')];
    }
    else {
      local_1 = '\x02';
      if (is_inter != 0) {
        local_1 = '\x01';
      }
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static inline TxSetType av1_get_ext_tx_set_type(TX_SIZE tx_size, int is_inter,
                                                int use_reduced_set) {
  const TX_SIZE tx_size_sqr_up = txsize_sqr_up_map[tx_size];
  if (tx_size_sqr_up > TX_32X32) return EXT_TX_SET_DCTONLY;
  if (tx_size_sqr_up == TX_32X32)
    return is_inter ? EXT_TX_SET_DCT_IDTX : EXT_TX_SET_DCTONLY;
  if (use_reduced_set)
    return is_inter ? EXT_TX_SET_DCT_IDTX : EXT_TX_SET_DTT4_IDTX;
  const TX_SIZE tx_size_sqr = txsize_sqr_map[tx_size];
  return av1_ext_tx_set_lookup[is_inter][tx_size_sqr == TX_16X16];
}